

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  pointer pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  Descriptor *desc;
  pointer piVar5;
  int *piVar6;
  value_type_conflict this_00;
  value_type pOVar7;
  pointer piVar8;
  string *psVar9;
  undefined1 split;
  unsigned_long uVar10;
  int iVar11;
  FieldDescriptor *field;
  long lVar12;
  unsigned_long uVar13;
  size_t sVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  int *piVar18;
  bool bVar19;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  pair<unsigned_long,_unsigned_long> pVar20;
  Formatter format;
  Iterator __begin3_1;
  string index_1;
  Iterator __end3_1;
  Iterator __end3;
  Iterator __begin3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  undefined1 local_220 [40];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_178 [32];
  char *local_158;
  Iterator local_150;
  Iterator local_140;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_130;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_118;
  Options local_100;
  
  desc = this->descriptor_;
  opts = &this->options_;
  Options::Options(&local_100,opts);
  anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)local_1f8,desc,&local_100);
  vars_00.len_ = ((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_1f8._0_8_;
  io::Printer::WithDefs(&local_118,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_1f8);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_100.field_listener_options.forbidden_field_listener_events.
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.annotation_guard_name._M_dataplus._M_p !=
      &local_100.annotation_guard_name.field_2) {
    operator_delete(local_100.annotation_guard_name._M_dataplus._M_p,
                    local_100.annotation_guard_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.annotation_pragma_name._M_dataplus._M_p !=
      &local_100.annotation_pragma_name.field_2) {
    operator_delete(local_100.annotation_pragma_name._M_dataplus._M_p,
                    local_100.annotation_pragma_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.runtime_include_base._M_dataplus._M_p != &local_100.runtime_include_base.field_2)
  {
    operator_delete(local_100.runtime_include_base._M_dataplus._M_p,
                    local_100.runtime_include_base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.dllexport_decl._M_dataplus._M_p != &local_100.dllexport_decl.field_2) {
    operator_delete(local_100.dllexport_decl._M_dataplus._M_p,
                    local_100.dllexport_decl.field_2._M_allocated_capacity + 1);
  }
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)local_1f8,this->descriptor_,opts);
  vars_01.len_ = ((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_01.ptr_ = (pointer)local_1f8._0_8_;
  io::Printer::WithDefs(&local_130,p,vars_01,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_1f8);
  local_220._8_8_ = 0;
  local_220._16_8_ = 0;
  local_220._24_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) != '\x01')) {
    pcVar16 = "~0u,  // no _has_bits_\n";
    sVar14 = 0x17;
  }
  else {
    pcVar16 = "PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n";
    sVar14 = 0x30;
  }
  vars = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_220 + 8);
  format_00._M_str = pcVar16;
  format_00._M_len = sVar14;
  local_220._0_8_ = p;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (p,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),vars,format_00);
  format_01._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n";
  format_01._M_len = 0x39;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_220._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_01);
  sVar15 = 0x32;
  sVar14 = 0x19;
  if (*(int *)(this->descriptor_ + 0x88) < 1) {
    sVar15 = 0x19;
  }
  pcVar16 = "~0u,  // no _extensions_\n";
  if (0 < *(int *)(this->descriptor_ + 0x88)) {
    pcVar16 = "PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n";
  }
  format_02._M_str = pcVar16;
  format_02._M_len = sVar15;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_220._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_02);
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    sVar14 = 0x35;
  }
  pcVar16 = "~0u,  // no _oneof_case_\n";
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    pcVar16 = "PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n";
  }
  format_03._M_str = pcVar16;
  format_03._M_len = sVar14;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_220._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_03);
  sVar14 = 0x1d;
  if (0 < this->num_weak_fields_) {
    sVar14 = 0x36;
  }
  pcVar16 = "~0u,  // no _weak_field_map_\n";
  if (0 < this->num_weak_fields_) {
    pcVar16 = "PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n";
  }
  format_04._M_str = pcVar16;
  format_04._M_len = sVar14;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_220._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_04);
  bVar19 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar14 = 0x44;
  if (bVar19) {
    sVar14 = 0x25;
  }
  pcVar16 = "PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n";
  if (bVar19) {
    pcVar16 = "~0u,  // no _inlined_string_donated_\n";
  }
  format_05._M_str = pcVar16;
  format_05._M_len = sVar14;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_220._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_05);
  bVar19 = ShouldSplit(this->descriptor_,opts);
  sVar14 = 0x2e;
  if (bVar19) {
    sVar14 = 0x50;
  }
  pcVar16 = "~0u,  // no _split_\n~0u,  // no sizeof(Split)\n";
  if (bVar19) {
    pcVar16 = "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n";
  }
  format_06._M_str = pcVar16;
  format_06._M_len = sVar14;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_220._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),vars,format_06);
  local_150.descriptor = this->descriptor_;
  iVar11 = *(int *)(local_150.descriptor + 4);
  iVar3 = *(int *)(local_150.descriptor + 0x7c);
  uVar10 = (long)iVar11 + (long)iVar3 + 8;
  local_140.idx = 0;
  local_150.idx = *(int *)(local_150.descriptor + 4);
  local_140.descriptor = local_150.descriptor;
  do {
    bVar19 = protobuf::internal::operator==(&local_140,&local_150);
    if (bVar19) {
      local_1f8._8_8_ = this->descriptor_;
      local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
      local_1a8._M_dataplus._M_p._0_4_ =
           *(undefined4 *)
            ((long)&(((pointer)local_1f8._8_8_)->annotation_).
                    super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                    ._M_payload.
                    super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                    .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>.
                    _M_payload + 0xc);
      lVar12 = 0;
      local_1a8._M_string_length = local_1f8._8_8_;
      while (bVar19 = cpp::operator==((Iterator *)local_1f8,(Iterator *)&local_1a8), !bVar19) {
        pOVar7 = OneOfRangeImpl::Iterator::operator*((Iterator *)local_1f8);
        Formatter::operator()
                  ((Formatter *)local_220,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pOVar7 + 8));
        local_1f8._0_4_ = local_1f8._0_4_ + 1;
        lVar12 = lVar12 + 1;
      }
      iVar4 = *(int *)(this->descriptor_ + 0x7c);
      if (iVar4 == (int)lVar12) {
        if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) == '\x01') {
          format_11._M_str = "0,\n1,\n";
          format_11._M_len = 6;
          io::Printer::
          FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    ((Printer *)local_220._0_8_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),
                     (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_220 + 8),format_11);
          uVar13 = (long)iVar11 + (long)iVar3 + 10;
        }
        else {
          piVar8 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar13 = uVar10;
          if (piVar8 != piVar5) {
            uVar13 = ((long)piVar5 - (long)piVar8 >> 2) + uVar10;
            pSVar1 = (pointer)(local_1f8 + 0x10);
            paVar2 = &local_1a8.field_2;
            uVar17 = 0;
            do {
              if (piVar8[uVar17] < 0) {
                local_1a8._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"~0u","");
              }
              else {
                lVar12 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                                   (piVar8[uVar17],(char *)pSVar1);
                local_1f8._0_8_ = lVar12 - (long)pSVar1;
                local_1f8._8_8_ = pSVar1;
                local_1a8._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,pSVar1,lVar12);
              }
              Formatter::operator()((Formatter *)local_220,"$1$,\n",&local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              uVar17 = uVar17 + 1;
              piVar8 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            } while (uVar17 < (ulong)((long)(this->has_bit_indices_).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish - (long)piVar8 >> 2));
          }
        }
        piVar18 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar6 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (piVar18 != piVar6) {
          uVar13 = uVar13 + ((long)piVar6 - (long)piVar18 >> 2);
          pSVar1 = (pointer)(local_1f8 + 0x10);
          do {
            if (*piVar18 < 0) {
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"~0u,","");
            }
            else {
              lVar12 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                                 (*piVar18,(char *)pSVar1);
              local_1f8._0_8_ = lVar12 - (long)pSVar1;
              local_1a8._M_dataplus._M_p = (pointer)0x1a;
              local_1a8._M_string_length = 0x3e4653;
              local_1f8._8_8_ = pSVar1;
              absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1c8,(AlphaNum *)local_1f8);
            }
            Formatter::operator()
                      ((Formatter *)local_220,"$1$\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            piVar18 = piVar18 + 1;
          } while (piVar18 != piVar6);
        }
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_220 + 8));
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&local_130);
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&local_118);
        pVar20.second = uVar10;
        pVar20.first = uVar13;
        return pVar20;
      }
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar12,(long)iVar4,"count == descriptor_->real_oneof_decl_count()");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                 ,0xa15,*(undefined8 *)(psVar9 + 8),*(undefined8 *)psVar9);
LAB_00204602:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_1f8);
    }
    this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        (&local_140);
    if (*(char *)(*(long *)(this_00 + 0x38) + 0x8c) == '\0') {
      if ((char)this_00[3] < '\0') {
        if (((byte)this_00[1] & 0x10) == 0) {
          iVar11 = 0xac6;
LAB_00204646:
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,iVar11);
        }
        lVar12 = *(long *)(this_00 + 0x28);
        if (lVar12 == 0) {
          iVar11 = 0xa9a;
          goto LAB_00204646;
        }
        if ((*(int *)(lVar12 + 4) != 1) || ((*(byte *)(*(long *)(lVar12 + 0x30) + 1) & 2) == 0))
        goto LAB_002040b8;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0xac7,0x14,"!res->is_synthetic()");
        goto LAB_00204602;
      }
      bVar19 = ShouldSplit(this_00,opts);
      local_158 = "";
      split = 0x56;
      if (bVar19) {
        local_158 = "::Impl_::Split";
      }
      bVar19 = ShouldSplit(this_00,opts);
      if (bVar19) {
        FieldName_abi_cxx11_((string *)local_178,(cpp *)this_00,field);
        local_1f8._0_8_ = local_178._8_8_;
        local_1f8._8_8_ = local_178._0_8_;
        local_1a8._M_dataplus._M_p = (pointer)0x1;
        local_1a8._M_string_length = 0x46ac7d;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1c8,(AlphaNum *)local_1f8);
      }
      else {
        FieldMemberName_abi_cxx11_
                  ((string *)local_1c8,(cpp *)this_00,(FieldDescriptor *)0x0,(bool)split);
      }
      Formatter::operator()
                ((Formatter *)local_220,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((bVar19) && ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10))) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
    }
    else {
LAB_002040b8:
      format_07._M_str = "::_pbi::kInvalidFieldOffsetTag";
      format_07._M_len = 0x1e;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_220._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_220 + 8),format_07);
    }
    bVar19 = ShouldSplit(this_00,opts);
    if (bVar19) {
      format_08._M_str = " | ::_pbi::kSplitFieldOffsetMask /*split*/";
      format_08._M_len = 0x2a;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_220._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_220 + 8),format_08);
    }
    bVar19 = IsEagerlyVerifiedLazy(this_00,opts,this->scc_analyzer_);
    sVar14 = 0x21;
    pcVar16 = " | 0x1u /*eagerly verified lazy*/";
    if (bVar19) {
LAB_00204147:
      format_09._M_str = pcVar16;
      format_09._M_len = sVar14;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_220._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_220 + 8),format_09);
    }
    else {
      bVar19 = IsStringInlined(this_00,opts);
      sVar14 = 0x13;
      pcVar16 = " | 0x1u /*inlined*/";
      if (bVar19) goto LAB_00204147;
    }
    format_10._M_str = ",\n";
    format_10._M_len = 2;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_220._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_220 + 8),format_10);
    local_140.idx = local_140.idx + 1;
  } while( true );
}

Assistant:

std::pair<size_t, size_t> MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  if (!has_bit_indices_.empty() || IsMapEntryMessage(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  } else {
    format("~0u,  // no _has_bits_\n");
  }
  format("PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n");
  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  } else {
    format("~0u,  // no _extensions_\n");
  }
  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  } else {
    format("~0u,  // no _oneof_case_\n");
  }
  if (num_weak_fields_ > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  } else {
    format("~0u,  // no _weak_field_map_\n");
  }
  if (!inlined_string_indices_.empty()) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  } else {
    format("~0u,  // no _inlined_string_donated_\n");
  }
  if (ShouldSplit(descriptor_, options_)) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  } else {
    format(
        "~0u,  // no _split_\n"
        "~0u,  // no sizeof(Split)\n");
  }
  const int kNumGenericOffsets = 8;  // the number of fixed offsets above
  const size_t offsets = kNumGenericOffsets + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask /*split*/");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | 0x1u /*eagerly verified lazy*/");
    } else if (IsStringInlined(field, options_)) {
      format(" | 0x1u /*inlined*/");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return std::make_pair(entries, offsets);
}